

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

float anon_unknown.dwarf_10e1::pw(float x,int y)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = 1.0;
  for (uVar1 = 0x32; uVar1 != 0; uVar1 = uVar1 >> 1) {
    if ((uVar1 & 1) != 0) {
      fVar2 = fVar2 * x;
    }
    x = x * x;
  }
  return fVar2;
}

Assistant:

float
pw (float x, int y)
{
    float p = 1;

    while (y)
    {
        if (y & 1) p *= x;

        x *= x;
        y >>= 1;
    }

    return p;
}